

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O2

void ihevc_sao_band_offset_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos_u,WORD32 sao_band_pos_v,
               WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  UWORD8 *pUVar8;
  WORD8 *pWVar9;
  bool bVar10;
  int local_138 [32];
  int local_b8 [34];
  
  uVar6 = 0;
  uVar3 = 0;
  if (0 < ht) {
    uVar3 = (ulong)(uint)ht;
  }
  pUVar8 = pu1_src + (long)wd + -1;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    pu1_src_left[uVar6 * 2] = pUVar8[-1];
    pu1_src_left[uVar6 * 2 + 1] = *pUVar8;
    pUVar8 = pUVar8 + src_strd;
  }
  *pu1_src_top_left = pu1_src_top[(long)wd + -2];
  pu1_src_top_left[1] = pu1_src_top[(long)wd + -1];
  uVar5 = 0;
  uVar6 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar6 = uVar5;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pu1_src_top[uVar5] = pu1_src[uVar5 + (long)((ht + -1) * src_strd)];
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    local_b8[lVar2] = 0;
    local_138[lVar2] = 0;
  }
  iVar1 = 0;
  while (iVar1 != 4) {
    iVar4 = iVar1 + 1;
    local_b8[sao_band_pos_u + iVar1 & 0x1f] = iVar4;
    local_138[iVar1 + sao_band_pos_v & 0x1f] = iVar4;
    iVar1 = iVar4;
  }
  for (iVar1 = 0; iVar1 != (int)uVar3; iVar1 = iVar1 + 1) {
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      bVar10 = (uVar5 & 1) == 0;
      pWVar9 = pi1_sao_offset_v;
      if (bVar10) {
        pWVar9 = pi1_sao_offset_u;
      }
      piVar7 = local_138;
      if (bVar10) {
        piVar7 = local_b8;
      }
      iVar4 = (int)pWVar9[piVar7[pu1_src[uVar5] >> 3]] + (uint)pu1_src[uVar5];
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      pu1_src[uVar5] = (UWORD8)iVar4;
    }
    pu1_src = pu1_src + src_strd;
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_chroma(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  WORD32 sao_band_pos_u,
                                  WORD32 sao_band_pos_v,
                                  WORD8 *pi1_sao_offset_u,
                                  WORD8 *pi1_sao_offset_v,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table_u[NUM_BAND_TABLE];
    WORD32 band_table_v[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + (wd - 2)];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    band_shift = BIT_DEPTH_CHROMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table_u[i] = 0;
        band_table_v[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table_u[(i + sao_band_pos_u) & 31] = i + 1;
        band_table_v[(i + sao_band_pos_v) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;
            WORD8 *pi1_sao_offset;

            pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;
            band_idx = (0 == col % 2) ? band_table_u[pu1_src[col] >> band_shift] : band_table_v[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}